

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_builder.cpp
# Opt level: O0

void __thiscall
Clasp::BasicProgramAdapter::rule
          (BasicProgramAdapter *this,Head_t param_2,AtomSpan *head,Weight_t bound,
          WeightLitSpan *body)

{
  bool bVar1;
  Literal LVar2;
  Literal LVar3;
  int iVar4;
  weight_t in_ECX;
  Span<unsigned_int> *in_RDX;
  undefined4 in_ESI;
  pair<Clasp::Literal,_int> *in_RDI;
  Span<Potassco::WeightLit_t> *in_R8;
  iterator end;
  iterator it;
  Weight_t sum;
  Literal *in_stack_ffffffffffffff98;
  pair<Clasp::Literal,_int> local_48;
  WeightLit_t *local_40;
  WeightLit_t *local_38;
  int local_2c;
  Span<Potassco::WeightLit_t> *local_28;
  weight_t bound_00;
  pair<Clasp::Literal,_int> *lits;
  undefined4 in_stack_fffffffffffffff8;
  
  local_28 = in_R8;
  lits = in_RDI;
  bVar1 = Potassco::empty<unsigned_int>(in_RDX);
  if (!bVar1) {
    Potassco::fail(-2,
                   "virtual void Clasp::BasicProgramAdapter::rule(Potassco::Head_t, const Potassco::AtomSpan &, Potassco::Weight_t, const Potassco::WeightLitSpan &)"
                   ,0x17d,"empty(head)","unsupported rule type",0);
  }
  bk_lib::
  pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>::
  clear((pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
         *)(in_RDI + 4));
  local_2c = 0;
  local_38 = Potassco::begin<Potassco::WeightLit_t>(local_28);
  local_40 = Potassco::end<Potassco::WeightLit_t>((Span<Potassco::WeightLit_t> *)0x1cc31b);
  for (; local_38 != local_40; local_38 = local_38 + 1) {
    LVar2 = toLit(0x1cc346);
    LVar3 = Literal::operator~(in_stack_ffffffffffffff98);
    std::pair<Clasp::Literal,_int>::pair<Clasp::Literal,_true>
              (&local_48,(Literal *)&stack0xffffffffffffffb4,&local_38->weight);
    bk_lib::
    pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>::
    push_back((pod_vector<std::pair<Clasp::Literal,_int>,_std::allocator<std::pair<Clasp::Literal,_int>_>_>
               *)CONCAT44(LVar3.rep_,LVar2.rep_),in_RDI);
    local_2c = local_38->weight + local_2c;
  }
  iVar4 = ProgramBuilder::type((ProgramBuilder *)0x1cc3ad);
  bound_00 = (weight_t)((ulong)in_RDX >> 0x20);
  if (iVar4 == 0) {
    SatBuilder::addConstraint
              ((SatBuilder *)CONCAT44(in_ESI,in_stack_fffffffffffffff8),(WeightLitVec *)lits,
               bound_00);
  }
  else {
    PBBuilder::addConstraint
              ((PBBuilder *)CONCAT44(in_ESI,in_stack_fffffffffffffff8),(WeightLitVec *)lits,bound_00
               ,SUB81((ulong)in_RDX >> 0x18,0),in_ECX);
  }
  return;
}

Assistant:

void BasicProgramAdapter::rule(Potassco::Head_t, const Potassco::AtomSpan& head, Potassco::Weight_t bound, const Potassco::WeightLitSpan& body) {
	using namespace Potassco;
	POTASSCO_REQUIRE(empty(head), "unsupported rule type");
	constraint_.clear();
	Potassco::Weight_t sum = 0;
	for (WeightLitSpan::iterator it = begin(body), end = Potassco::end(body); it != end; ++it) {
		constraint_.push_back(WeightLiteral(~toLit(it->lit), it->weight));
		sum += it->weight;
	}
	if (prg_->type() == Problem_t::Sat) {
		static_cast<SatBuilder&>(*prg_).addConstraint(constraint_, (sum - bound) + 1);
	}
	else {
		static_cast<PBBuilder&>(*prg_).addConstraint(constraint_, (sum - bound) + 1);
	}
}